

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_rdft.cc
# Opt level: O1

void cftfsub_128_C(float *a)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  (*cft1st_128)(a);
  (*cftmdl_128)(a);
  uVar1 = 0xfffffffffffffffe;
  do {
    fVar5 = a[uVar1 + 2] + a[uVar1 + 0x22];
    fVar6 = a[uVar1 + 3] + a[uVar1 + 0x23];
    fVar3 = a[uVar1 + 2] - a[uVar1 + 0x22];
    fVar2 = a[uVar1 + 3] - a[uVar1 + 0x23];
    fVar7 = a[uVar1 + 0x42] + a[uVar1 + 0x62];
    fVar9 = a[uVar1 + 0x43] + a[uVar1 + 99];
    fVar4 = a[uVar1 + 0x42] - a[uVar1 + 0x62];
    fVar8 = a[uVar1 + 0x43] - a[uVar1 + 99];
    a[uVar1 + 2] = fVar5 + fVar7;
    a[uVar1 + 3] = fVar6 + fVar9;
    a[uVar1 + 0x42] = fVar5 - fVar7;
    a[uVar1 + 0x43] = fVar6 - fVar9;
    a[uVar1 + 0x22] = fVar3 - fVar8;
    a[uVar1 + 0x23] = fVar2 + fVar4;
    a[uVar1 + 0x62] = fVar8 + fVar3;
    a[uVar1 + 99] = fVar2 - fVar4;
    uVar1 = uVar1 + 2;
  } while (uVar1 < 0x1e);
  return;
}

Assistant:

static void cftfsub_128_C(float* a) {
  int j, j1, j2, j3, l;
  float x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;

  cft1st_128(a);
  cftmdl_128(a);
  l = 32;
  for (j = 0; j < l; j += 2) {
    j1 = j + l;
    j2 = j1 + l;
    j3 = j2 + l;
    x0r = a[j] + a[j1];
    x0i = a[j + 1] + a[j1 + 1];
    x1r = a[j] - a[j1];
    x1i = a[j + 1] - a[j1 + 1];
    x2r = a[j2] + a[j3];
    x2i = a[j2 + 1] + a[j3 + 1];
    x3r = a[j2] - a[j3];
    x3i = a[j2 + 1] - a[j3 + 1];
    a[j] = x0r + x2r;
    a[j + 1] = x0i + x2i;
    a[j2] = x0r - x2r;
    a[j2 + 1] = x0i - x2i;
    a[j1] = x1r - x3i;
    a[j1 + 1] = x1i + x3r;
    a[j3] = x1r + x3i;
    a[j3 + 1] = x1i - x3r;
  }
}